

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> __thiscall
enact::Parser::expectTypenamePrecPrimary(Parser *this,string *msg,bool emptyAllowed)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  ParseError *__return_storage_ptr__;
  byte in_CL;
  undefined7 in_register_00000011;
  unique_ptr<enact::BasicTypename,_std::default_delete<enact::BasicTypename>_> local_120;
  undefined1 local_118 [16];
  string local_108;
  allocator<char> local_e1;
  string local_e0 [32];
  undefined1 local_c0 [8];
  undefined1 local_b8 [8];
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  elementTypenames;
  Token paren;
  allocator<char> local_51;
  string local_50;
  unique_ptr<enact::BasicTypename,_std::default_delete<enact::BasicTypename>_> local_30;
  byte local_21;
  string *psStack_20;
  bool emptyAllowed_local;
  string *msg_local;
  Parser *this_local;
  
  psStack_20 = (string *)CONCAT71(in_register_00000011,emptyAllowed);
  local_21 = in_CL & 1;
  msg_local = msg;
  this_local = this;
  bVar1 = consume((Parser *)msg,IDENTIFIER);
  if (bVar1) {
    std::make_unique<enact::BasicTypename,enact::Token&>((Token *)&local_30);
    std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>::
    unique_ptr<enact::BasicTypename,std::default_delete<enact::BasicTypename>,void>
              ((unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>> *)this,
               &local_30);
    std::unique_ptr<enact::BasicTypename,_std::default_delete<enact::BasicTypename>_>::~unique_ptr
              (&local_30);
  }
  else {
    bVar1 = consume((Parser *)msg,DOLLAR);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Expected type variable name after \'$\'.",&local_51);
      expect((Parser *)msg,IDENTIFIER,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator(&local_51);
      std::make_unique<enact::VariableTypename,enact::Token&>((Token *)&paren.line);
      std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>::
      unique_ptr<enact::VariableTypename,std::default_delete<enact::VariableTypename>,void>
                ((unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>> *)
                 this,(unique_ptr<enact::VariableTypename,_std::default_delete<enact::VariableTypename>_>
                       *)&paren.line);
      std::unique_ptr<enact::VariableTypename,_std::default_delete<enact::VariableTypename>_>::
      ~unique_ptr((unique_ptr<enact::VariableTypename,_std::default_delete<enact::VariableTypename>_>
                   *)&paren.line);
    }
    else {
      bVar1 = consume((Parser *)msg,LEFT_PAREN);
      if (bVar1) {
        Token::Token((Token *)&elementTypenames.
                               super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (Token *)&msg[5].field_2);
        std::
        vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
        ::vector((vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
                  *)local_b8);
        bVar1 = check((Parser *)msg,RIGHT_PAREN);
        if (!bVar1) {
          do {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (local_e0,"Expected typename after \'(\'.",&local_e1);
            expectTypename((Parser *)local_c0,msg,SUB81(local_e0,0));
            std::
            vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
            ::push_back((vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
                         *)local_b8,(value_type *)local_c0);
            std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::
            ~unique_ptr((unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
                         *)local_c0);
            std::__cxx11::string::~string(local_e0);
            std::allocator<char>::~allocator(&local_e1);
            bVar1 = consume((Parser *)msg,COMMA);
          } while (bVar1);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_108,"Expected \')\' after typename elements.",
                   (allocator<char> *)(local_118 + 0xf));
        expect((Parser *)msg,RIGHT_PAREN,&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        std::allocator<char>::~allocator((allocator<char> *)(local_118 + 0xf));
        sVar2 = std::
                vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
                ::size((vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
                        *)local_b8);
        if (sVar2 == 1) {
          pvVar3 = std::
                   vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
                   ::operator[]((vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
                                 *)local_b8,0);
          std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::
          unique_ptr((unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
                      *)this,pvVar3);
        }
        else {
          std::
          make_unique<enact::TupleTypename,std::vector<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::allocator<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>>,enact::Token>
                    ((vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
                      *)local_118,(Token *)local_b8);
          std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>::
          unique_ptr<enact::TupleTypename,std::default_delete<enact::TupleTypename>,void>
                    ((unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>> *
                     )this,(unique_ptr<enact::TupleTypename,_std::default_delete<enact::TupleTypename>_>
                            *)local_118);
          std::unique_ptr<enact::TupleTypename,_std::default_delete<enact::TupleTypename>_>::
          ~unique_ptr((unique_ptr<enact::TupleTypename,_std::default_delete<enact::TupleTypename>_>
                       *)local_118);
        }
        local_118._8_4_ = 1;
        std::
        vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
        ::~vector((vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
                   *)local_b8);
        Token::~Token((Token *)&elementTypenames.
                                super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        if ((local_21 & 1) == 0) {
          __return_storage_ptr__ = (ParseError *)__cxa_allocate_exception(0x10);
          error(__return_storage_ptr__,(Parser *)msg,psStack_20);
          __cxa_throw(__return_storage_ptr__,&ParseError::typeinfo,ParseError::~ParseError);
        }
        std::make_unique<enact::BasicTypename,char_const(&)[1],enact::Token&>
                  ((char (*) [1])&local_120,(Token *)0x14329d);
        std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>::
        unique_ptr<enact::BasicTypename,std::default_delete<enact::BasicTypename>,void>
                  ((unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>> *)
                   this,&local_120);
        std::unique_ptr<enact::BasicTypename,_std::default_delete<enact::BasicTypename>_>::
        ~unique_ptr(&local_120);
      }
    }
  }
  return (__uniq_ptr_data<const_enact::Typename,_std::default_delete<const_enact::Typename>,_true,_true>
          )(__uniq_ptr_data<const_enact::Typename,_std::default_delete<const_enact::Typename>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const Typename> Parser::expectTypenamePrecPrimary(const std::string &msg, bool emptyAllowed) {
        if (consume(TokenType::IDENTIFIER)) {
            return std::make_unique<BasicTypename>(m_previous);
        }

        if (consume(TokenType::DOLLAR)) {
            expect(TokenType::IDENTIFIER, "Expected type variable name after '$'.");
            return std::make_unique<VariableTypename>(m_previous);
        }

        // Unit/grouped/tuple typename?
        if (consume(TokenType::LEFT_PAREN)) {
            Token paren = m_previous;

            std::vector<std::unique_ptr<const Typename>> elementTypenames;

            if (!check(TokenType::RIGHT_PAREN)) {
                do {
                    elementTypenames.push_back(expectTypename("Expected typename after '('."));
                } while (consume(TokenType::COMMA));
            }

            expect(TokenType::RIGHT_PAREN, "Expected ')' after typename elements.");

            // 1-tuples are equivalent to their contained type
            if (elementTypenames.size() == 1) {
                return std::move(elementTypenames[0]);
            } else {
                return std::make_unique<TupleTypename>(std::move(elementTypenames), std::move(paren));
            }
        }

        if (emptyAllowed) {
            return std::make_unique<BasicTypename>("", m_previous);
        }

        throw error(msg);
    }